

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallFinalizableHeapBucket.cpp
# Opt level: O3

void __thiscall
Memory::
SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
::TransferDisposedObjects
          (SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
           *this)

{
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *list;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  bVar2 = HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>::
          IsAllocationStopped((HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
                               *)this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBucket.cpp"
                       ,0x99,"(!this->IsAllocationStopped())","!this->IsAllocationStopped()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  list = this->pendingDisposeList;
  if (list != (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    this->pendingDisposeList = (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
    HeapBlockList::
    ForEach<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>,Memory::SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>>::TransferDisposedObjects()::_lambda(Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
              (list,0);
    HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>::
    AppendAllocableHeapBlockList
              ((HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_> *)
               this,list);
  }
  HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>::
  VerifyHeapBlockCount
            ((HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_> *)
             this,false);
  return;
}

Assistant:

void
SmallFinalizableHeapBucketBaseT<TBlockType>::TransferDisposedObjects()
{
    Assert(!this->IsAllocationStopped());
    TBlockType * currentPendingDisposeList = this->pendingDisposeList;
    if (currentPendingDisposeList != nullptr)
    {
        this->pendingDisposeList = nullptr;

        HeapBlockList::ForEach(currentPendingDisposeList, [=](TBlockType * heapBlock)
        {
            heapBlock->TransferDisposedObjects();
            Assert(heapBlock->HasFreeObject());
        });

        // For partial collect, dispose will modify the object, and we
        // also touch the page by chaining the object through the free list
        // might as well reuse the block for partial collect
        this->AppendAllocableHeapBlockList(currentPendingDisposeList);
    }

    RECYCLER_SLOW_CHECK(this->VerifyHeapBlockCount(false));
}